

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

string * stringformat<long>(string *__return_storage_ptr__,char *fmt,long *args)

{
  stringstream buf;
  StringFormatter<long> local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1b0.args.super__Tuple_impl<0UL,_long>.super__Head_base<0UL,_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_long>)*args;
  local_1b0.fmt = fmt;
  StringFormatter<long>::tostream(&local_1b0,local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}